

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

EmitInfo __thiscall Wasm::WasmBytecodeGenerator::EmitV128BitSelect(WasmBytecodeGenerator *this)

{
  WasmRegisterSpace *this_00;
  WasmType local_38;
  uint local_34;
  EmitInfo EStack_30;
  RegSlot resultReg;
  EmitInfo arg1Info;
  EmitInfo arg2Info;
  EmitInfo mask;
  WasmBytecodeGenerator *this_local;
  EmitInfo resultInfo;
  
  arg2Info = PopEvalStack(this,V128,(char16 *)0x0);
  arg1Info = PopEvalStack(this,V128,(char16 *)0x0);
  EStack_30 = PopEvalStack(this,V128,(char16 *)0x0);
  ReleaseLocation(this,&arg2Info);
  ReleaseLocation(this,&arg1Info);
  ReleaseLocation(this,&stack0xffffffffffffffd0);
  this_00 = GetRegisterSpace(this,V128);
  local_34 = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
  local_38 = V128;
  EmitInfo::EmitInfo((EmitInfo *)&this_local,local_34,&local_38);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x11])
            (this->m_writer,0x126,(ulong)local_34,(ulong)EStack_30 & 0xffffffff,
             (ulong)arg1Info & 0xffffffff,(ulong)arg2Info & 0xffffffff);
  return (EmitInfo)this_local;
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitV128BitSelect()
{
    EmitInfo mask = PopEvalStack(WasmTypes::V128);
    EmitInfo arg2Info = PopEvalStack(WasmTypes::V128);
    EmitInfo arg1Info = PopEvalStack(WasmTypes::V128);

    ReleaseLocation(&mask);
    ReleaseLocation(&arg2Info);
    ReleaseLocation(&arg1Info);

    Js::RegSlot resultReg = GetRegisterSpace(WasmTypes::V128)->AcquireTmpRegister();
    EmitInfo resultInfo(resultReg, WasmTypes::V128);
    m_writer->AsmReg4(Js::OpCodeAsmJs::Simd128_BitSelect_I4, resultReg, arg1Info.location, arg2Info.location, mask.location);
    return resultInfo;
}